

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

pair<std::error_code,_std::shared_ptr<ylt::metric::summary_t>_> * __thiscall
ylt::metric::static_metric_manager<test_id_t<9ul>>::
create_metric_static<ylt::metric::summary_t,std::vector<double,std::allocator<double>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          (static_metric_manager<test_id_t<9UL>_> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args_1)

{
  byte bVar1;
  pair<std::error_code,_std::shared_ptr<ylt::metric::summary_t>_> *in_RDI;
  bool r;
  shared_ptr<ylt::metric::summary_t> m;
  pair<std::error_code,_std::nullptr_t> *in_stack_ffffffffffffff18;
  pair<std::error_code,_std::shared_ptr<ylt::metric::summary_t>_> *__x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  
  __x = in_RDI;
  std::
  make_shared<ylt::metric::summary_t,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<double,std::allocator<double>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40
            );
  std::shared_ptr<ylt::metric::static_metric>::shared_ptr<ylt::metric::summary_t,void>
            ((shared_ptr<ylt::metric::static_metric> *)in_RDI,
             (shared_ptr<ylt::metric::summary_t> *)in_stack_ffffffffffffff18);
  bVar1 = static_metric_manager<test_id_t<9UL>_>::register_metric
                    ((static_metric_manager<test_id_t<9UL>_> *)in_stack_ffffffffffffff50,
                     (shared_ptr<ylt::metric::static_metric> *)
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::shared_ptr<ylt::metric::static_metric>::~shared_ptr
            ((shared_ptr<ylt::metric::static_metric> *)0x248c3c);
  if ((bVar1 & 1) == 0) {
    std::make_error_code(0);
    std::make_pair<std::error_code,decltype(nullptr)>
              (&in_RDI->first,(void **)in_stack_ffffffffffffff18);
    std::pair<std::error_code,_std::shared_ptr<ylt::metric::summary_t>_>::
    pair<std::error_code,_std::nullptr_t,_true>(in_RDI,in_stack_ffffffffffffff18);
  }
  else {
    std::error_code::error_code(&in_RDI->first);
    std::make_pair<std::error_code,std::shared_ptr<ylt::metric::summary_t>&>
              (&__x->first,(shared_ptr<ylt::metric::summary_t> *)in_RDI);
  }
  std::shared_ptr<ylt::metric::summary_t>::~shared_ptr
            ((shared_ptr<ylt::metric::summary_t> *)0x248d18);
  return __x;
}

Assistant:

std::pair<std::error_code, std::shared_ptr<T>> create_metric_static(
      const std::string& name, const std::string& help, Args&&... args) {
    auto m = std::make_shared<T>(name, help, std::forward<Args>(args)...);
    bool r = register_metric(m);
    if (!r) {
      return std::make_pair(std::make_error_code(std::errc::invalid_argument),
                            nullptr);
    }

    return std::make_pair(std::error_code{}, m);
  }